

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_precision_qualifiers_glsl_abi_cxx11_(CompilerGLSL *this,uint32_t id)

{
  SPIRType *flags;
  uint32_t id_00;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  Compiler *this_00;
  TypedID<(spirv_cross::Types)0> local_50 [5];
  allocator local_39;
  SPIRType *local_38;
  SPIRType *result_type;
  SPIRType *pSStack_28;
  bool use_precision_qualifiers;
  SPIRType *type;
  Compiler *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  this_00 = (Compiler *)CONCAT44(in_register_00000034,id);
  type._4_4_ = in_EDX;
  pCStack_18 = this_00;
  this_local = this;
  pSStack_28 = Compiler::expression_type(this_00,in_EDX);
  result_type._7_1_ = this_00[2].aliased_variables.stack_storage.aligned_char[0x1a] & 1;
  if ((result_type._7_1_ != 0) &&
     ((*(int *)&(pSStack_28->super_IVariant).field_0xc == 0x10 ||
      (*(int *)&(pSStack_28->super_IVariant).field_0xc == 0x11)))) {
    id_00 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_28->image);
    local_38 = Compiler::get<spirv_cross::SPIRType>(this_00,id_00);
    if (local_38->width < 0x20) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"mediump ",&local_39);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
      return this;
    }
  }
  flags = pSStack_28;
  TypedID<(spirv_cross::Types)0>::TypedID(local_50,type._4_4_);
  ::std::
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  ::operator[](&(this_00->ir).meta,local_50);
  flags_to_qualifiers_glsl_abi_cxx11_(this,(SPIRType *)this_00,(Bitset *)flags);
  return this;
}

Assistant:

string CompilerGLSL::to_precision_qualifiers_glsl(uint32_t id)
{
	auto &type = expression_type(id);
	bool use_precision_qualifiers = backend.allow_precision_qualifiers;
	if (use_precision_qualifiers && (type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage))
	{
		// Force mediump for the sampler type. We cannot declare 16-bit or smaller image types.
		auto &result_type = get<SPIRType>(type.image.type);
		if (result_type.width < 32)
			return "mediump ";
	}
	return flags_to_qualifiers_glsl(type, ir.meta[id].decoration.decoration_flags);
}